

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_lha.c
# Opt level: O2

void test_read_format_lha(void)

{
  uchar *in_RCX;
  size_t in_RDX;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t in_R8;
  
  verify((EVP_PKEY_CTX *)"test_read_format_lha_header0.lzh",(uchar *)0x1,in_RDX,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_header1.lzh",(uchar *)0x1,siglen,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_header2.lzh",(uchar *)0x1,siglen_00,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_header3.lzh",(uchar *)0x0,siglen_01,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_lh6.lzh",(uchar *)0x1,siglen_02,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_lh7.lzh",(uchar *)0x1,siglen_03,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_lh0.lzh",(uchar *)0x1,siglen_04,in_RCX,in_R8);
  verify((EVP_PKEY_CTX *)"test_read_format_lha_withjunk.lzh",(uchar *)0x1,siglen_05,in_RCX,in_R8);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_lha)
{
	/* Verify Header level 0 */
	verify("test_read_format_lha_header0.lzh", 1);
	/* Verify Header level 1 */
	verify("test_read_format_lha_header1.lzh", 1);
	/* Verify Header level 2 */
	verify("test_read_format_lha_header2.lzh", 1);
	/* Verify Header level 3
	 * This test data can be made in Windows only. */
	verify("test_read_format_lha_header3.lzh", 0);
	/* Verify compression mode -lh6- */
	verify("test_read_format_lha_lh6.lzh", 1);
	/* Verify compression mode -lh7- */
	verify("test_read_format_lha_lh7.lzh", 1);
	/* Verify no compression -lh0- */
	verify("test_read_format_lha_lh0.lzh", 1);
	/* Verify an lha file with junk data. */
	verify("test_read_format_lha_withjunk.lzh", 1);
}